

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_DsdManAddDsd(If_DsdMan_t *p,char *pDsd,word *pTruth,uchar *pPerm,int *pnSupp)

{
  int iVar1;
  int iVar2;
  int local_1f78 [2];
  int pMatches [2000];
  int fCompl;
  int iRes;
  int *pnSupp_local;
  uchar *pPerm_local;
  word *pTruth_local;
  char *pDsd_local;
  If_DsdMan_t *p_local;
  
  pMatches[1999] = -1;
  pTruth_local = (word *)pDsd;
  if (*pDsd == '!') {
    pTruth_local = (word *)(pDsd + 1);
  }
  pMatches[0x7ce] = (int)(*pDsd == '!');
  pDsd_local = (char *)p;
  iVar1 = Dau_DsdIsConst0((char *)pTruth_local);
  if (iVar1 == 0) {
    iVar1 = Dau_DsdIsConst1((char *)pTruth_local);
    if (iVar1 == 0) {
      iVar1 = Dau_DsdIsVar((char *)pTruth_local);
      if (iVar1 == 0) {
        If_DsdMergeMatches((char *)pTruth_local,local_1f78);
        pMatches[1999] =
             If_DsdManAddDsd_rec((char *)pTruth_local,(char **)&pTruth_local,local_1f78,
                                 (If_DsdMan_t *)pDsd_local,pTruth,pPerm,pnSupp);
      }
      else {
        iVar2 = Dau_DsdReadVar((char *)pTruth_local);
        iVar1 = *pnSupp;
        *pnSupp = iVar1 + 1;
        pPerm[iVar1] = (uchar)iVar2;
        pMatches[1999] = 2;
      }
    }
    else {
      pMatches[1999] = 1;
    }
  }
  else {
    pMatches[1999] = 0;
  }
  iVar1 = Abc_LitNotCond(pMatches[1999],pMatches[0x7ce]);
  return iVar1;
}

Assistant:

int If_DsdManAddDsd( If_DsdMan_t * p, char * pDsd, word * pTruth, unsigned char * pPerm, int * pnSupp )
{
    int iRes = -1, fCompl = 0;
    if ( *pDsd == '!' )
         pDsd++, fCompl = 1;
    if ( Dau_DsdIsConst0(pDsd) )
        iRes = 0;
    else if ( Dau_DsdIsConst1(pDsd) )
        iRes = 1;
    else if ( Dau_DsdIsVar(pDsd) )
    {
        pPerm[(*pnSupp)++] = Dau_DsdReadVar(pDsd);
        iRes = 2;
    }
    else
    {
        int pMatches[DAU_MAX_STR];
        If_DsdMergeMatches( pDsd, pMatches );
        iRes = If_DsdManAddDsd_rec( pDsd, &pDsd, pMatches, p, pTruth, pPerm, pnSupp );
    }
    return Abc_LitNotCond( iRes, fCompl );
}